

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-domain-socket-server.c
# Opt level: O0

int main(void)

{
  undefined4 __fd;
  int iVar1;
  ssize_t sVar2;
  size_t sVar3;
  socklen_t local_2104;
  int local_2100;
  socklen_t fromlen;
  int len;
  int ok;
  sockaddr_un from;
  char buff [8192];
  undefined1 local_7e [2];
  int ret;
  sockaddr_un addr;
  int fd;
  
  addr.sun_path[0x68] = '\0';
  addr.sun_path[0x69] = '\0';
  addr.sun_path[0x6a] = '\0';
  addr.sun_path[0x6b] = '\0';
  fromlen = 1;
  local_2104 = 0x6e;
  addr.sun_path._100_4_ = socket(1,2,0);
  if ((int)addr.sun_path._100_4_ < 0) {
    perror("socket");
    fromlen = 0;
  }
  if (fromlen != 0) {
    memset(local_7e,0,0x6e);
    local_7e = (undefined1  [2])0x1;
    strcpy((char *)&ret,"server.sock");
    unlink("server.sock");
    iVar1 = bind(addr.sun_path._100_4_,(sockaddr *)local_7e,0x6e);
    if (iVar1 < 0) {
      perror("bind");
      fromlen = 0;
    }
  }
  do {
    sVar2 = recvfrom(addr.sun_path._100_4_,from.sun_path + 100,0x2000,0,(sockaddr *)((long)&len + 2)
                     ,&local_2104);
    local_2100 = (int)sVar2;
    if (local_2100 < 1) goto LAB_00101367;
    printf("recvfrom: %s\n",from.sun_path + 100);
    strcpy(from.sun_path + 100,"transmit good!");
    __fd = addr.sun_path._100_4_;
    sVar3 = strlen(from.sun_path + 100);
    sVar2 = sendto(__fd,from.sun_path + 100,sVar3 + 1,0,(sockaddr *)((long)&len + 2),local_2104);
  } while (-1 < (int)sVar2);
  perror("sendto");
LAB_00101367:
  if (-1 < (int)addr.sun_path._100_4_) {
    close(addr.sun_path._100_4_);
  }
  return 0;
}

Assistant:

int main() {
    int fd;
    struct sockaddr_un addr;
    int ret;
    char buff[8192];
    struct sockaddr_un from;
    int ok = 1;
    int len;
    socklen_t fromlen = sizeof(from);
    
    //////********* UNIX domain  *********//////////
    ///// UNIX domain sockets are a method by which processes on the same host can communicate. 
    /////Communication is bidirectional with stream sockets and unidirectional with datagram sockets.
    
    // i.e fd = socket(AF_UNIX, SOCK_STREAM, 0);
    
    /// PF= Protocol family: Unix domain sockets  PF_UNIX=AF_UNIX
    //NOTE: SOCK_DGRAM socket datagram type communication.
    if ((fd = socket(PF_UNIX, SOCK_DGRAM, 0)) < 0) {
        perror("socket");
        ok = 0;
    }

    if (ok) {
        
        memset(&addr, 0, sizeof(addr));
        ///  AF=Address familu UNIX
        addr.sun_family = AF_UNIX;
        ////// path name = server.sock
        strcpy(addr.sun_path, SERVER_SOCK_FILE);
        // unlink() - delete name and if it's possible the file which is referring for by the name.
        unlink(SERVER_SOCK_FILE);
        //// int bind (int fd, const struct sockaddr *addr, int addrlen)
        ////  link the socket using the file descriptor a local or a network Address, memorized into addr.
        if (bind(fd, (struct sockaddr *)&addr, sizeof(addr)) < 0) {
            perror("bind");
            ok = 0;
        }
    }
    
    /// With the SOCK SOCK_DGRAM option it's possibile use the recvfrom function with more details.
    ////ssize_t recvfrom(int sockfd, void *buf, size_t len, int flags, struct sockaddr *src_addr, socklen_t *addrlen);
    while ((len = recvfrom(fd, buff, 8192, 0, (struct sockaddr *)&from, &fromlen)) > 0) {
        printf ("recvfrom: %s\n", buff);
        strcpy (buff, "transmit good!");
        /// With the SOCK SOCK_DGRAM option it's possibile use the sendto function with more details.
        /// ssize_t sendto(int sockfd, const void *buf, size_t len, int flags,const struct sockaddr *dest_addr, socklen_t addrlen);
        ret = sendto(fd, buff, strlen(buff)+1, 0, (struct sockaddr *)&from, fromlen);
        if (ret < 0) {
            perror("sendto");
            break;
        }
    }
    

    if (fd >= 0) {
        close(fd);
    }

    return 0;
}